

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchThreadLock_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchThreadLock_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  duration<long,_std::ratio<1L,_1L>_> local_120;
  duration<long,_std::ratio<1L,_1000000000L>_> local_118;
  duration<long,_std::ratio<1L,_1000000000L>_> local_110;
  duration<long,_std::ratio<1L,_1000000000L>_> local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  undefined4 local_e0;
  uint local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  duration<long,_std::ratio<1L,_1L>_> local_78;
  undefined8 local_70;
  bool local_61;
  int local_60;
  int iStack_5c;
  bool result;
  duration<long,_std::ratio<1L,_1L>_> local_58;
  thread local_50;
  thread thread;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  unique_ptr<bidfx_public_api::tools::CountdownLatch,_std::default_delete<bidfx_public_api::tools::CountdownLatch>_>
  local_28;
  undefined1 local_20 [8];
  shared_ptr<bidfx_public_api::tools::CountdownLatch> latch;
  CountdownLatchTest_TestCountdownLatchThreadLock_Test *this_local;
  
  latch.super___shared_ptr<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_unique<bidfx_public_api::tools::CountdownLatch,int>((int *)&local_28);
  std::shared_ptr<bidfx_public_api::tools::CountdownLatch>::
  shared_ptr<bidfx_public_api::tools::CountdownLatch,std::default_delete<bidfx_public_api::tools::CountdownLatch>,void>
            ((shared_ptr<bidfx_public_api::tools::CountdownLatch> *)local_20,&local_28);
  std::
  unique_ptr<bidfx_public_api::tools::CountdownLatch,_std::default_delete<bidfx_public_api::tools::CountdownLatch>_>
  ::~unique_ptr(&local_28);
  thread._M_id._M_thread = (id)std::chrono::_V2::system_clock::now();
  iStack_5c = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_58,&stack0xffffffffffffffa4);
  local_60 = 2;
  std::thread::
  thread<void(&)(std::shared_ptr<bidfx_public_api::tools::CountdownLatch>,std::chrono::duration<long,std::ratio<1l,1000l>>,int),std::shared_ptr<bidfx_public_api::tools::CountdownLatch>&,std::chrono::duration<long,std::ratio<1l,1l>>,int,void>
            (&local_50,SleepThenCountdownLatch,
             (shared_ptr<bidfx_public_api::tools::CountdownLatch> *)local_20,&local_58,&local_60);
  peVar3 = std::
           __shared_ptr_access<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  end.__d.__r._4_4_ = 0x1e;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_78,(int *)((long)&end.__d.__r + 4));
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_70,&local_78);
  bVar1 = bidfx_public_api::tools::CountdownLatch::Await(peVar3,local_70);
  local_61 = (bool)(bVar1 & 1);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::chrono::_V2::system_clock::now();
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_98,(AssertionResult *)"result","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x3e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_dc = 0;
  std::
  __shared_ptr_access<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_20);
  local_e0 = bidfx_public_api::tools::CountdownLatch::GetCount();
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_d8,"0",(int *)"latch->GetCount()",&local_dc,&local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x3f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_110.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&gtest_ar_.message_);
  local_118.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&thread);
  local_108.__r = (rep)std::chrono::operator-(&local_110,&local_118);
  local_124 = 0x1e;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_120,&local_124);
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1l>>>
            ((internal *)local_100,"end.time_since_epoch() - start.time_since_epoch()",
             "std::chrono::seconds(30)",&local_108,&local_120);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::thread::join();
  std::thread::~thread(&local_50);
  std::shared_ptr<bidfx_public_api::tools::CountdownLatch>::~shared_ptr
            ((shared_ptr<bidfx_public_api::tools::CountdownLatch> *)local_20);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchThreadLock)
{
    std::shared_ptr<CountdownLatch> latch = std::make_unique<CountdownLatch>(2);
    std::chrono::time_point<std::chrono::system_clock> start = std::chrono::system_clock::now();
    std::thread thread(SleepThenCountdownLatch, latch, std::chrono::seconds(1), 2);
    bool result = latch->Await(std::chrono::seconds(30));
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    EXPECT_TRUE(result);
    EXPECT_EQ(0, latch->GetCount());
    EXPECT_LT(end.time_since_epoch() - start.time_since_epoch(),std::chrono::seconds(30));
    thread.join();
}